

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_mem.c
# Opt level: O1

void zt_mem_pools_display(int offset,int flags)

{
  zt_mem_pool *pool;
  
  printf("%*sPools { \n",(ulong)(uint)(offset * 5),"");
  if (pools.next != &pools) {
    pool = (zt_mem_pool *)pools.next;
    do {
      zt_mem_pool_display(offset + 1,pool,flags);
      pool = (zt_mem_pool *)(pool->pool_list).next;
    } while (pool != (zt_mem_pool *)&pools);
  }
  printf("%*s}\n",(ulong)(uint)(offset * 5),"");
  return;
}

Assistant:

void
zt_mem_pools_display(int offset, int flags)
{
    zt_elist_t  * tmp;
    zt_mem_pool * pool;

    printf(BLANK "Pools { \n", INDENT(offset));
    zt_elist_for_each(&pools, tmp) {
        pool = zt_elist_data(tmp, zt_mem_pool, pool_list);
        zt_mem_pool_display(offset + 1, pool, flags);
    }
    printf(BLANK "}\n", INDENT(offset));
}